

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
libcellml::Units::unitAttributes
          (Units *this,StandardUnit standardUnit,string *prefix,double *exponent,double *multiplier,
          string *id)

{
  UnitsImpl *this_00;
  mapped_type *reference;
  const_iterator cVar1;
  string dummyReference;
  StandardUnit local_54;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_00 = (UnitsImpl *)(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  local_54 = standardUnit;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,&local_54);
  cVar1 = UnitsImpl::findUnit(this_00,reference);
  unitAttributes(this,((long)((long)cVar1._M_current -
                             (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].
                             mId.field_2._M_allocated_capacity) >> 4) * 0x6db6db6db6db6db7,&local_50
                 ,prefix,exponent,multiplier,id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Units::unitAttributes(StandardUnit standardUnit, std::string &prefix, double &exponent, double &multiplier, std::string &id) const
{
    std::string dummyReference;
    unitAttributes(static_cast<size_t>(pFunc()->findUnit(standardUnitToString.at(standardUnit)) - pFunc()->mUnitDefinitions.begin()), dummyReference, prefix, exponent, multiplier, id);
}